

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::startElement
          (AbstractDOMParser *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  bool bVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  uint uVar4;
  uint uVar5;
  XMLScanner *this_00;
  QName *pQVar6;
  DOMDocumentImpl *pDVar7;
  DOMNode *pDVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var11;
  undefined4 extraout_var_01;
  XMLAttr *this_01;
  DOMNode *pDVar12;
  XMLCh *pXVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar14;
  long *plVar15;
  XMLCh *pXVar16;
  XMLBuffer *pXVar17;
  undefined8 uVar18;
  long *plVar19;
  long *plVar20;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ulong uVar21;
  long *plVar22;
  undefined8 *puVar23;
  DOMException *this_02;
  XMLCh *pXVar24;
  XMLCh *pXVar25;
  DOMDocument *doc;
  XMLSize_t index;
  XMLSize_t getAt;
  ulong uVar26;
  uint uriId;
  pointer_____offset_0x10___ *ppuVar27;
  XMLSize_t XVar28;
  XMLBufBid elemQName;
  int colonPos;
  DOMNode *local_90;
  int local_54;
  XMLSize_t local_50;
  DOMAttrMapImpl *local_48;
  XMLCh *local_40;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  this_00 = this->fScanner;
  bVar1 = this_00->fDoNamespaces;
  local_50 = attrCount;
  local_40 = elemPrefix;
  local_38 = &attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
  if (bVar1 == true) {
    pXVar16 = elemDecl->fElementName->fLocalPart;
    if (this_00->fEmptyNamespaceId == urlId) {
      pp_Var11 = (this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler;
      pXVar25 = (XMLCh *)0x0;
    }
    else {
      pXVar25 = XMLScanner::getURIText(this_00,urlId);
      if ((elemPrefix != (XMLCh *)0x0) && (*elemPrefix != L'\0')) {
        pXVar17 = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
        pXVar17->fIndex = 0;
        XMLBuffer::append(pXVar17,elemPrefix);
        if (pXVar17->fIndex == pXVar17->fCapacity) {
          XMLBuffer::ensureCapacity(pXVar17,1);
        }
        XVar28 = pXVar17->fIndex;
        pXVar17->fIndex = XVar28 + 1;
        pXVar17->fBuffer[XVar28] = L':';
        XMLBuffer::append(pXVar17,pXVar16);
        pXVar17->fBuffer[pXVar17->fIndex] = L'\0';
        iVar9 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x25])
                          (this,pXVar25,elemPrefix);
        local_90 = (DOMNode *)CONCAT44(extraout_var_00,iVar9);
        XMLBufferMgr::releaseBuffer(&this->fBufMgr,pXVar17);
        goto LAB_002dfcc4;
      }
      pp_Var11 = (this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler;
    }
    iVar9 = (*pp_Var11[0x25])(this,pXVar25,0,pXVar16,pXVar16);
    local_90 = (DOMNode *)CONCAT44(extraout_var_01,iVar9);
  }
  else {
    pXVar16 = QName::getRawName(elemDecl->fElementName);
    iVar9 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x24])(this,pXVar16);
    local_90 = (DOMNode *)CONCAT44(extraout_var,iVar9);
  }
LAB_002dfcc4:
  XVar28 = local_50;
  if (local_50 != 0) {
    uVar10 = this->fScanner->fEmptyNamespaceId;
    uVar4 = this->fScanner->fXMLNSNamespaceId;
    local_48 = (DOMAttrMapImpl *)local_90[0xf]._vptr_DOMNode;
    DOMAttrMapImpl::reserve(local_48,local_50);
    getAt = 0;
    do {
      this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt(local_38,getAt);
      pQVar6 = this_01->fAttName;
      if (bVar1 == false) {
        iVar9 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x26])
                          (this,pQVar6->fLocalPart);
        pDVar12 = (DOMNode *)CONCAT44(extraout_var_02,iVar9);
        DOMAttrMapImpl::setNamedItemFast(local_48,pDVar12);
      }
      else {
        uVar5 = pQVar6->fURIId;
        pXVar16 = pQVar6->fLocalPart;
        pXVar25 = pQVar6->fPrefix;
        if (((pXVar25 == (XMLCh *)0x0) || (uriId = uVar5, *pXVar25 == L'\0')) &&
           (uriId = uVar4, pXVar16 != L"xmlns")) {
          pXVar24 = L"xmlns";
          if (pXVar16 == (XMLCh *)0x0) {
LAB_002dfd9d:
            uriId = uVar5;
            if (*pXVar24 == L'\0') {
              uriId = uVar4;
            }
          }
          else {
            pXVar24 = L"xmlns";
            pXVar13 = pXVar16;
            do {
              XVar2 = *pXVar13;
              if (XVar2 == L'\0') goto LAB_002dfd9d;
              pXVar13 = pXVar13 + 1;
              XVar3 = *pXVar24;
              pXVar24 = pXVar24 + 1;
              uriId = uVar5;
            } while (XVar2 == XVar3);
          }
        }
        if (uriId == uVar10) {
          pXVar24 = (XMLCh *)0x0;
        }
        else {
          pXVar24 = XMLScanner::getURIText(this->fScanner,uriId);
        }
        pXVar13 = XMLAttr::getQName(this_01);
        iVar9 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x27])
                          (this,pXVar24,pXVar25,pXVar16,pXVar13);
        pDVar12 = (DOMNode *)CONCAT44(extraout_var_03,iVar9);
        DOMAttrMapImpl::setNamedItemNSFast(local_48,pDVar12);
        XVar28 = local_50;
      }
      (*pDVar12->_vptr_DOMNode[0x38])(pDVar12,this_01->fValue);
      if (this_01->fType == ID) {
        pDVar7 = this->fDocument;
        if (pDVar7->fNodeIDMap == (DOMNodeIDMap *)0x0) {
          iVar9 = (*(pDVar7->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(pDVar7,0x30);
          doc = &this->fDocument->super_DOMDocument;
          if (this->fDocument == (DOMDocumentImpl *)0x0) {
            doc = (DOMDocument *)0x0;
          }
          DOMNodeIDMap::DOMNodeIDMap((DOMNodeIDMap *)CONCAT44(extraout_var_04,iVar9),500,doc);
          this->fDocument->fNodeIDMap = (DOMNodeIDMap *)CONCAT44(extraout_var_04,iVar9);
        }
        DOMNodeIDMap::add(this->fDocument->fNodeIDMap,(DOMAttr *)pDVar12);
        *(ushort *)&pDVar12[5]._vptr_DOMNode = *(ushort *)&pDVar12[5]._vptr_DOMNode | 0x100;
      }
      (*pDVar12->_vptr_DOMNode[0x33])(pDVar12,(ulong)this_01->fSpecified);
      if (this->fCreateSchemaInfo == true) {
        ppuVar27 = &DOMTypeInfoImpl::g_DtdNotValidatedAttribute;
        if ((ulong)(uint)this_01->fType < 10) {
          ppuVar27 = (pointer_____offset_0x10___ *)
                     (&PTR_g_DtdValidatedCDATAAttribute_00416d58)[(uint)this_01->fType];
        }
        (*pDVar12->_vptr_DOMNode[0x35])(pDVar12,ppuVar27);
      }
      getAt = getAt + 1;
    } while (getAt != XVar28);
  }
  iVar9 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])();
  if ((char)iVar9 != '\0') {
    iVar9 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])();
    plVar22 = (long *)CONCAT44(extraout_var_05,iVar9);
    lVar14 = (**(code **)(*plVar22 + 0x50))(plVar22);
    if (lVar14 != 0) {
      uVar26 = 0;
      do {
        plVar15 = (long *)(**(code **)(*plVar22 + 0x58))(plVar22,uVar26);
        if (*(uint *)(plVar15 + 1) < 2) {
          if (bVar1 == false) {
            pDVar7 = this->fDocument;
            uVar18 = (**(code **)(*plVar15 + 0x28))(plVar15);
            iVar9 = (*(pDVar7->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x32])(pDVar7,uVar18);
            plVar19 = (long *)CONCAT44(extraout_var_06,iVar9);
            iVar9 = (*local_90->_vptr_DOMNode[0x48])(local_90,plVar19);
            plVar20 = (long *)CONCAT44(extraout_var_07,iVar9);
            if (plVar20 != (long *)0x0) {
              (**(code **)(*plVar20 + 0x138))(plVar20);
            }
          }
          else {
            pXVar16 = (XMLCh *)(**(code **)(*plVar15 + 0x28))(plVar15);
            pXVar17 = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
            local_54 = -1;
            uVar10 = XMLScanner::resolveQName
                               (this->fScanner,pXVar16,pXVar17,Mode_Attribute,&local_54);
            if (pXVar16 == L"xmlns") {
LAB_002dffd5:
              uVar10 = this->fScanner->fXMLNSNamespaceId;
            }
            else {
              pXVar25 = L"xmlns";
              if (pXVar16 == (XMLCh *)0x0) {
LAB_002dffcf:
                if (*pXVar25 == L'\0') goto LAB_002dffd5;
              }
              else {
                pXVar25 = L"xmlns";
                pXVar24 = pXVar16;
                do {
                  XVar2 = *pXVar24;
                  if (XVar2 == L'\0') goto LAB_002dffcf;
                  pXVar24 = pXVar24 + 1;
                  XVar3 = *pXVar25;
                  pXVar25 = pXVar25 + 1;
                } while (XVar2 == XVar3);
              }
            }
            if (uVar10 == this->fScanner->fEmptyNamespaceId) {
              pXVar25 = (XMLCh *)0x0;
            }
            else {
              pXVar25 = XMLScanner::getURIText(this->fScanner,uVar10);
            }
            iVar9 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                              (this->fDocument,pXVar25,pXVar16);
            plVar19 = (long *)CONCAT44(extraout_var_08,iVar9);
            iVar9 = (*local_90->_vptr_DOMNode[0x49])(local_90,plVar19);
            plVar20 = (long *)CONCAT44(extraout_var_09,iVar9);
            if (plVar20 != (long *)0x0) {
              (**(code **)(*plVar20 + 0x138))(plVar20);
            }
            XMLBufferMgr::releaseBuffer(&this->fBufMgr,pXVar17);
          }
          if (plVar15[4] != 0) {
            (**(code **)(*plVar19 + 0x1c0))(plVar19);
            (**(code **)(*plVar19 + 0x198))(plVar19,0);
          }
          if (this->fCreateSchemaInfo == true) {
            ppuVar27 = &DOMTypeInfoImpl::g_DtdNotValidatedAttribute;
            if ((ulong)*(uint *)((long)plVar15 + 0xc) < 10) {
              ppuVar27 = (pointer_____offset_0x10___ *)
                         (&PTR_g_DtdValidatedCDATAAttribute_00416d58)
                         [*(uint *)((long)plVar15 + 0xc)];
            }
            (**(code **)(*plVar19 + 0x1a8))(plVar19,ppuVar27);
          }
        }
        (**(code **)(*plVar15 + 0x30))(plVar15);
        uVar26 = uVar26 + 1;
        uVar21 = (**(code **)(*plVar22 + 0x50))(plVar22);
      } while (uVar26 < uVar21);
    }
  }
  pXVar16 = local_40;
  pDVar8 = this->fCurrentParent;
  pDVar12 = &(this->fDocument->super_DOMDocument).super_DOMNode;
  if (this->fDocument == (DOMDocumentImpl *)0x0) {
    pDVar12 = (DOMNode *)0x0;
  }
  if (pDVar8 == pDVar12) {
    (*pDVar8->_vptr_DOMNode[0x11])(pDVar8,local_90);
  }
  else {
    if (pDVar8 == (DOMNode *)0x0) {
      plVar22 = (long *)0x0;
    }
    else {
      plVar22 = (long *)__dynamic_cast(pDVar8,&DOMNode::typeinfo,&HasDOMParentImpl::typeinfo,
                                       0xfffffffffffffffe);
    }
    if ((plVar22 == (long *)0x0) || (lVar14 = (**(code **)(*plVar22 + 0x10))(plVar22), lVar14 == 0))
    {
      this_02 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
      __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
    }
    puVar23 = (undefined8 *)(**(code **)(*plVar22 + 0x10))(plVar22);
    (**(code **)*puVar23)(puVar23,local_90);
  }
  this->fCurrentParent = local_90;
  this->fCurrentNode = local_90;
  this->fWithinElement = true;
  if (isEmpty) {
    (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[6])
              (this,elemDecl,(ulong)urlId,(ulong)isRoot,pXVar16);
  }
  return;
}

Assistant:

void AbstractDOMParser::startElement(const XMLElementDecl&   elemDecl
                             , const unsigned int            urlId
                             , const XMLCh* const            elemPrefix
                             , const RefVectorOf<XMLAttr>&   attrList
                             , const XMLSize_t               attrCount
                             , const bool                    isEmpty
                             , const bool                    isRoot)
{
    DOMElement     *elem;
    DOMElementImpl *elemImpl;
    const XMLCh* namespaceURI = 0;
    bool doNamespaces = fScanner->getDoNamespaces();

    // Create the element name. Here we are going to bypass the
    // DOMDocument::createElement() interface and instantiate the
    // required types directly in order to avoid name checking
    // overhead.
    //
    if (doNamespaces)
    {
        //DOM Level 2, doNamespaces on
        //
        const XMLCh* localName = elemDecl.getBaseName();

        if (urlId != fScanner->getEmptyNamespaceId()) {  //TagName has a prefix

            namespaceURI = fScanner->getURIText(urlId); //get namespaceURI

            if (elemPrefix && *elemPrefix)
            {
                XMLBufBid elemQName(&fBufMgr);

                elemQName.set(elemPrefix);
                elemQName.append(chColon);
                elemQName.append(localName);

                elem = createElementNS (
                  namespaceURI, elemPrefix, localName, elemQName.getRawBuffer());
            }
            else
              elem = createElementNS (namespaceURI, 0, localName, localName);
        }
        else
          elem = createElementNS (namespaceURI, 0, localName, localName);
    }
    else
    {   //DOM Level 1
        elem = createElement (elemDecl.getFullName());
    }

    elemImpl = (DOMElementImpl *) elem;

    if (attrCount)
    {
      unsigned int xmlnsNSId = fScanner->getXMLNSNamespaceId();
      unsigned int emptyNSId = fScanner->getEmptyNamespaceId();

      DOMAttrMapImpl* map = elemImpl->fAttributes;
      map->reserve (attrCount);

      for (XMLSize_t index = 0; index < attrCount; ++index)
      {
        const XMLAttr* oneAttrib = attrList.elementAt(index);
        DOMAttrImpl *attr = 0;

        if (doNamespaces)
        {
            //DOM Level 2, doNamespaces on
            //
            unsigned int attrURIId = oneAttrib->getURIId();
            const XMLCh* localName = oneAttrib->getName();
            const XMLCh* prefix = oneAttrib->getPrefix();
            namespaceURI = 0;

            if ((prefix==0 || *prefix==0) && XMLString::equals(localName, XMLUni::fgXMLNSString))
            {
                // xmlns=...
                attrURIId = xmlnsNSId;
            }
            if (attrURIId != emptyNSId)
            {
                //TagName has a prefix
                namespaceURI = fScanner->getURIText(attrURIId);
            }

            attr = (DOMAttrImpl*) createAttrNS (namespaceURI,
                                                prefix,
                                                localName,
                                                oneAttrib->getQName());

            map->setNamedItemNSFast(attr);
        }
        else
        {
            attr = (DOMAttrImpl*) createAttr (oneAttrib->getName());
            map->setNamedItemFast(attr);
        }

        attr->setValueFast(oneAttrib->getValue());

        // Attributes of type ID.  If this is one, add it to the hashtable of IDs
        //   that is constructed for use by GetElementByID().
        //
        if (oneAttrib->getType()==XMLAttDef::ID)
        {
            if (fDocument->fNodeIDMap == 0)
                fDocument->fNodeIDMap = new (fDocument) DOMNodeIDMap(500, fDocument);
            fDocument->fNodeIDMap->add(attr);
            attr->fNode.isIdAttr(true);
        }

        attr->setSpecified(oneAttrib->getSpecified());

        // store DTD validation information
        if(fCreateSchemaInfo)
        {
            switch(oneAttrib->getType())
            {
            case XMLAttDef::CData:          attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute); break;
            case XMLAttDef::ID:             attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDAttribute); break;
            case XMLAttDef::IDRef:          attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute); break;
            case XMLAttDef::IDRefs:         attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute); break;
            case XMLAttDef::Entity:         attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute); break;
            case XMLAttDef::Entities:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute); break;
            case XMLAttDef::NmToken:        attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute); break;
            case XMLAttDef::NmTokens:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute); break;
            case XMLAttDef::Notation:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute); break;
            case XMLAttDef::Enumeration:    attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute); break;
            default:                        attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdNotValidatedAttribute); break;
            }
        }
      }
    }

    //Set up the default attributes if any.
    //
    if (elemDecl.hasAttDefs())
    {
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;
        DOMAttrImpl * insertAttr = 0;

        for(XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);

            const XMLAttDef::DefAttTypes defType = attr->getDefaultType();
            if ((defType == XMLAttDef::Default)
            ||  (defType == XMLAttDef::Fixed))
            {

                if (doNamespaces)
                {
                    // DOM Level 2 wants all namespace declaration attributes
                    // to be bound to "http://www.w3.org/2000/xmlns/"
                    // So as long as the XML parser doesn't do it, it needs to
                    // be done here.
                    const XMLCh* qualifiedName = attr->getFullName();
                    XMLBufBid bbPrefixQName(&fBufMgr);
                    XMLBuffer& prefixBuf = bbPrefixQName.getBuffer();
                    int colonPos = -1;
                    unsigned int uriId = fScanner->resolveQName(qualifiedName, prefixBuf, ElemStack::Mode_Attribute, colonPos);

                    const XMLCh* namespaceURI = 0;
                    if (XMLString::equals(qualifiedName, XMLUni::fgXMLNSString))    //for xmlns=...
                        uriId = fScanner->getXMLNSNamespaceId();
                    if (uriId != fScanner->getEmptyNamespaceId()) {  //TagName has a prefix
                        namespaceURI = fScanner->getURIText(uriId);
                    }

                    insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(namespaceURI,     // NameSpaceURI
                                                                              qualifiedName);   // qualified name

                    DOMAttr* remAttr = elemImpl->setDefaultAttributeNodeNS(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                else
                {
                    // Namespaces is turned off...
                    insertAttr = (DOMAttrImpl *) fDocument->createAttribute(attr->getFullName());

                    DOMNode* remAttr = elemImpl->setDefaultAttributeNode(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                //need to do this before the get as otherwise we overwrite any value in the attr
                if (attr->getValue() != 0)
                {
                    insertAttr->setValueFast(attr->getValue());
                    insertAttr->setSpecified(false);
                }

                // store DTD validation information
                if(fCreateSchemaInfo)
                {
                    switch(attr->getType())
                    {
                    case XMLAttDef::CData:          insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute); break;
                    case XMLAttDef::ID:             insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDAttribute); break;
                    case XMLAttDef::IDRef:          insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute); break;
                    case XMLAttDef::IDRefs:         insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute); break;
                    case XMLAttDef::Entity:         insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute); break;
                    case XMLAttDef::Entities:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute); break;
                    case XMLAttDef::NmToken:        insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute); break;
                    case XMLAttDef::NmTokens:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute); break;
                    case XMLAttDef::Notation:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute); break;
                    case XMLAttDef::Enumeration:    insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute); break;
                    default:                        insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdNotValidatedAttribute); break;
                    }
                }
            }

            insertAttr = 0;
            attr->reset();
        }
    }

    if (fCurrentParent != fDocument)
      castToParentImpl (fCurrentParent)->appendChildFast (elem);
    else
      fCurrentParent->appendChild (elem);

    fCurrentParent = elem;
    fCurrentNode = elem;
    fWithinElement = true;

    // If an empty element, do end right now (no endElement() will be called)
    if (isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}